

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O0

void calcBias<Blob<768>,Blob<128>>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  code *in_RDI;
  byte in_R8B;
  int bitB;
  int bitA;
  int iOut;
  int iBit;
  int *cursor;
  int irep;
  Blob<128> B;
  Blob<128> A;
  Blob<768> K;
  int hashbits;
  int keybits;
  int hashbytes;
  int keybytes;
  uint32_t local_c8;
  uint32_t local_c4;
  int *in_stack_ffffffffffffff40;
  int iVar3;
  undefined4 in_stack_ffffffffffffff4c;
  Rand *in_stack_ffffffffffffff50;
  Blob<128> local_a4;
  Blob<768> local_94;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  byte local_21;
  int local_14;
  vector<int,_std::allocator<int>_> *local_10;
  code *local_8;
  
  local_21 = in_R8B & 1;
  local_28 = 0x60;
  local_2c = 0x10;
  local_30 = 0x300;
  local_34 = 0x80;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Blob<768>::Blob(&local_94);
  Blob<128>::Blob(&local_a4);
  Blob<128>::Blob((Blob<128> *)&stack0xffffffffffffff4c);
  for (iVar3 = 0; iVar3 < local_14; iVar3 = iVar3 + 1) {
    if (((local_21 & 1) != 0) && (iVar3 % (local_14 / 10) == 0)) {
      printf(".");
    }
    Rand::rand_p(in_stack_ffffffffffffff50,(void *)CONCAT44(in_stack_ffffffffffffff4c,iVar3),
                 (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    (*local_8)(&local_94,0x60,0,&local_a4);
    in_stack_ffffffffffffff40 = std::vector<int,_std::allocator<int>_>::operator[](local_10,0);
    for (local_c4 = 0; (int)local_c4 < 0x300; local_c4 = local_c4 + 1) {
      flipbit(&local_94,0x60,local_c4);
      (*local_8)(&local_94,0x60,0,&stack0xffffffffffffff4c);
      flipbit(&local_94,0x60,local_c4);
      for (local_c8 = 0; (int)local_c8 < 0x80; local_c8 = local_c8 + 1) {
        uVar1 = getbit(&local_a4,0x10,local_c8);
        uVar2 = getbit(&stack0xffffffffffffff4c,0x10,local_c8);
        *in_stack_ffffffffffffff40 = (uVar1 ^ uVar2) + *in_stack_ffffffffffffff40;
        in_stack_ffffffffffffff40 = in_stack_ffffffffffffff40 + 1;
      }
    }
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}